

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_reorder_fold.hpp
# Opt level: O2

ans_reorder_fold_decode<3U> *
ans_reorder_fold_decode<3U>::load
          (ans_reorder_fold_decode<3U> *__return_storage_ptr__,uint8_t *in_u8)

{
  uint uVar1;
  pointer pdVar2;
  undefined1 auVar3 [16];
  uint32_t uVar4;
  uint64_t uVar5;
  pointer puVar6;
  int iVar7;
  size_t i;
  long lVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  size_t sym;
  ulong uVar12;
  uint8_t *in_u8_00;
  undefined1 auVar13 [64];
  undefined1 in_XMM1 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> most_frequent;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  undefined1 extraout_var [56];
  
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->table).
  super__Vector_base<dec_entry_reorder_fold,_std::allocator<dec_entry_reorder_fold>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->table).
  super__Vector_base<dec_entry_reorder_fold,_std::allocator<dec_entry_reorder_fold>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->table).
  super__Vector_base<dec_entry_reorder_fold,_std::allocator<dec_entry_reorder_fold>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar7 = *(int *)in_u8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60,0x400,
             (allocator_type *)&local_48);
  in_u8_00 = in_u8 + 4;
  lVar8 = 0;
  if (iVar7 == 1) {
    for (; lVar8 != 0x400; lVar8 = lVar8 + 1) {
      local_60._M_impl.super__Vector_impl_data._M_start[lVar8] = *(uint *)(in_u8_00 + lVar8 * 4);
    }
    in_u8_00 = in_u8 + 0x1004;
  }
  else {
    for (; lVar8 != 0x400; lVar8 = lVar8 + 1) {
      local_60._M_impl.super__Vector_impl_data._M_start[lVar8] = (uint)lVar8;
    }
  }
  ans_load_interp((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,in_u8_00);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&__return_storage_ptr__->nfreqs,&local_48);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  iVar7 = 0;
  for (puVar6 = (__return_storage_ptr__->nfreqs).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar6 != (__return_storage_ptr__->nfreqs).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish; puVar6 = puVar6 + 1) {
    iVar7 = iVar7 + *puVar6;
  }
  uVar5 = (uint64_t)iVar7;
  auVar3 = vcvtusi2sd_avx512f(in_XMM1,uVar5);
  __return_storage_ptr__->frame_size = uVar5;
  __return_storage_ptr__->frame_mask = uVar5 - 1;
  auVar13._0_8_ = log2(auVar3._0_8_);
  auVar13._8_56_ = extraout_var;
  uVar5 = vcvttsd2usi_avx512f(auVar13._0_16_);
  __return_storage_ptr__->frame_log2 = uVar5;
  std::vector<dec_entry_reorder_fold,_std::allocator<dec_entry_reorder_fold>_>::resize
            (&__return_storage_ptr__->table,__return_storage_ptr__->frame_size);
  puVar6 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar7 = 0;
  lVar8 = (long)(__return_storage_ptr__->nfreqs).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar6;
  for (uVar12 = 0; uVar12 <= (lVar8 >> 2) - 1U; uVar12 = uVar12 + 1) {
    uVar1 = puVar6[uVar12];
    iVar9 = 0;
    uVar11 = (uint)uVar12;
    if (0x3ff < uVar11) {
      iVar9 = ((uVar11 - 0x400) / 0x3fc) * 0x40000000 + 0x40000000;
    }
    uVar4 = ans_reorder_fold_undo_mapping<3u>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60,uVar11);
    pdVar2 = (__return_storage_ptr__->table).
             super__Vector_base<dec_entry_reorder_fold,_std::allocator<dec_entry_reorder_fold>_>.
             _M_impl.super__Vector_impl_data._M_start;
    for (uVar10 = 0; uVar1 != uVar10; uVar10 = uVar10 + 1) {
      uVar11 = iVar7 + (int)uVar10;
      pdVar2[uVar11].freq = (uint16_t)uVar1;
      pdVar2[uVar11].mapped_num = uVar4 + iVar9;
      pdVar2[uVar11].offset = (uint16_t)uVar10;
    }
    puVar6 = (__return_storage_ptr__->nfreqs).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar7 = iVar7 + puVar6[uVar12];
  }
  __return_storage_ptr__->lower_bound = __return_storage_ptr__->frame_size << 4;
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_60);
  return __return_storage_ptr__;
}

Assistant:

static ans_reorder_fold_decode load(const uint8_t* in_u8)
    {
        ans_reorder_fold_decode model;
        auto in_ptr_u32 = reinterpret_cast<const uint32_t*>(in_u8);
        in_u8 += sizeof(uint32_t);
        uint32_t do_reorder = *in_ptr_u32++;
        size_t no_except_thres = 1 << (fidelity + 8 - 1);
        std::vector<uint32_t> most_frequent(no_except_thres);
        if (do_reorder == 1) {
            for (size_t i = 0; i < no_except_thres; i++) {
                most_frequent[i] = *in_ptr_u32++;
            }
            in_u8 += no_except_thres * sizeof(uint32_t);
        } else {
            for (size_t i = 0; i < no_except_thres; i++) {
                most_frequent[i] = i;
            }
        }

        model.nfreqs = ans_load_interp(in_u8);
        model.frame_size = std::accumulate(
            std::begin(model.nfreqs), std::end(model.nfreqs), 0);
        model.frame_mask = model.frame_size - 1;
        model.frame_log2 = log2(model.frame_size);
        model.table.resize(model.frame_size);
        auto max_sym = model.nfreqs.size() - 1;
        uint64_t tmp = constants::K * constants::RADIX;
        uint32_t cur_base = 0;
        for (size_t sym = 0; sym <= max_sym; sym++) {
            auto cur_freq = model.nfreqs[sym];
            uint32_t except_bytes
                = ans_reorder_fold_exception_bytes<fidelity>(sym);
            uint32_t mapped_num
                = ans_reorder_fold_undo_mapping<fidelity>(most_frequent, sym)
                + (except_bytes << 30);
            for (uint32_t k = 0; k < cur_freq; k++) {
                model.table[cur_base + k].freq = cur_freq;
                model.table[cur_base + k].mapped_num = mapped_num;
                model.table[cur_base + k].offset = k;
            }
            cur_base += model.nfreqs[sym];
        }
        model.lower_bound = constants::K * model.frame_size;
        return model;
    }